

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Server_setObjectTypeNode_lifecycleManagement
          (UA_Server *server,UA_NodeId nodeId,UA_ObjectLifecycleManagement olm)

{
  UA_StatusCode UVar1;
  UA_StatusCode retval;
  UA_Server *server_local;
  UA_ObjectLifecycleManagement olm_local;
  
  olm_local.constructor = (_func_void_ptr_UA_NodeId *)olm.destructor;
  server_local = (UA_Server *)olm.constructor;
  UVar1 = UA_Server_editNode(server,&adminSession,&nodeId,setOLM,&server_local);
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_setObjectTypeNode_lifecycleManagement(UA_Server *server, UA_NodeId nodeId,
                                                UA_ObjectLifecycleManagement olm) {
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession, &nodeId,
                                              (UA_EditNodeCallback)setOLM, &olm);
    UA_RCU_UNLOCK();
    return retval;
}